

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_api.c
# Opt level: O0

amqp_rpc_reply_t * amqp_channel_close(amqp_connection_state_t state,amqp_channel_t channel,int code)

{
  uint in_ECX;
  amqp_rpc_reply_t *in_RDI;
  void *in_stack_00000008;
  amqp_channel_close_t req;
  amqp_method_number_t replies [2];
  char codestr [13];
  char local_1d [29];
  
  sprintf(local_1d,"%d",(ulong)in_ECX);
  amqp_simple_rpc((amqp_connection_state_t)req.reply_text.bytes,req.reply_text.len._6_2_,
                  (amqp_method_number_t)req.reply_text.len,(amqp_method_number_t *)req._0_8_,
                  in_stack_00000008);
  return in_RDI;
}

Assistant:

amqp_rpc_reply_t amqp_channel_close(amqp_connection_state_t state,
                                    amqp_channel_t channel,
                                    int code)
{
  char codestr[13];
  amqp_method_number_t replies[2] = { AMQP_CHANNEL_CLOSE_OK_METHOD, 0};
  amqp_channel_close_t req;

  req.reply_code = code;
  req.reply_text.bytes = codestr;
  req.reply_text.len = sprintf(codestr, "%d", code);
  req.class_id = 0;
  req.method_id = 0;

  return amqp_simple_rpc(state, channel, AMQP_CHANNEL_CLOSE_METHOD,
                         replies, &req);
}